

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deps_log.cc
# Opt level: O0

bool __thiscall DepsLog::IsDepsEntryLiveFor(DepsLog *this,Node *node)

{
  Edge *pEVar1;
  Edge *this_00;
  byte local_77;
  allocator<char> local_61;
  string local_60;
  string local_40;
  Node *local_20;
  Node *node_local;
  DepsLog *this_local;
  
  local_20 = node;
  node_local = (Node *)this;
  pEVar1 = Node::in_edge(node);
  local_77 = 0;
  if (pEVar1 != (Edge *)0x0) {
    this_00 = Node::in_edge(local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"deps",&local_61);
    Edge::GetBinding(&local_40,this_00,&local_60);
    local_77 = std::__cxx11::string::empty();
    local_77 = local_77 ^ 0xff;
  }
  this_local._7_1_ = local_77 & 1;
  if (pEVar1 != (Edge *)0x0) {
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool DepsLog::IsDepsEntryLiveFor(Node* node) {
  // Skip entries that don't have in-edges or whose edges don't have a
  // "deps" attribute. They were in the deps log from previous builds, but
  // the the files they were for were removed from the build and their deps
  // entries are no longer needed.
  // (Without the check for "deps", a chain of two or more nodes that each
  // had deps wouldn't be collected in a single recompaction.)
  return node->in_edge() && !node->in_edge()->GetBinding("deps").empty();
}